

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_lrzip.c
# Opt level: O0

int archive_write_lrzip_open(archive_write_filter *f)

{
  int iVar1;
  undefined1 auStack_30 [4];
  int r;
  archive_string as;
  write_lrzip *data;
  archive_write_filter *f_local;
  
  as.buffer_length = (size_t)f->data;
  _auStack_30 = (char *)0x0;
  as.length = 0;
  as.s = (char *)0x0;
  archive_strncat((archive_string *)auStack_30,"lrzip -q",8);
  switch(*(undefined4 *)(as.buffer_length + 0xc)) {
  case 0:
    break;
  case 1:
    archive_strcat((archive_string *)auStack_30," -b");
    break;
  case 2:
    archive_strcat((archive_string *)auStack_30," -g");
    break;
  case 3:
    archive_strcat((archive_string *)auStack_30," -l");
    break;
  case 4:
    archive_strcat((archive_string *)auStack_30," -n");
    break;
  case 5:
    archive_strcat((archive_string *)auStack_30," -z");
  }
  if (0 < *(int *)(as.buffer_length + 8)) {
    archive_strcat((archive_string *)auStack_30," -L ");
    archive_strappend_char
              ((archive_string *)auStack_30,(char)*(undefined4 *)(as.buffer_length + 8) + '0');
  }
  iVar1 = __archive_write_program_open
                    (f,*(archive_write_program_data **)as.buffer_length,_auStack_30);
  archive_string_free((archive_string *)auStack_30);
  return iVar1;
}

Assistant:

static int
archive_write_lrzip_open(struct archive_write_filter *f)
{
	struct write_lrzip *data = (struct write_lrzip *)f->data;
	struct archive_string as;
	int r;

	archive_string_init(&as);
	archive_strcpy(&as, "lrzip -q");

	/* Specify compression type. */
	switch (data->compression) {
	case lzma:/* default compression */
		break;
	case bzip2:
		archive_strcat(&as, " -b");
		break;
	case gzip:
		archive_strcat(&as, " -g");
		break;
	case lzo:
		archive_strcat(&as, " -l");
		break;
	case none:
		archive_strcat(&as, " -n");
		break;
	case zpaq:
		archive_strcat(&as, " -z");
		break;
	}

	/* Specify compression level. */
	if (data->compression_level > 0) {
		archive_strcat(&as, " -L ");
		archive_strappend_char(&as, '0' + data->compression_level);
	}

	r = __archive_write_program_open(f, data->pdata, as.s);
	archive_string_free(&as);
	return (r);
}